

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

bool __thiscall cmCTestCVS::UpdateImpl(cmCTestCVS *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *command;
  pointer pbVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> cvs_update;
  string opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  UpdateParser out;
  UpdateParser err;
  string local_928;
  string local_908;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8e8;
  undefined1 local_8d0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a8 [13];
  char *local_7d0;
  char *local_700;
  char *local_630;
  char *local_560;
  char *local_490;
  undefined1 local_478 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450 [13];
  char *local_378;
  char *local_2a8;
  char *local_1d8;
  char *local_108;
  char *local_38;
  
  pcVar2 = (this->super_cmCTestVC).CTest;
  pcVar1 = local_8d0 + 0x10;
  local_8d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_908,pcVar2,(string *)local_8d0);
  command = extraout_RDX;
  if ((pointer)local_8d0._0_8_ != pcVar1) {
    operator_delete((void *)local_8d0._0_8_,local_8d0._16_8_ + 1);
    command = extraout_RDX_00;
  }
  if ((char *)local_908._M_string_length == (char *)0x0) {
    pcVar2 = (this->super_cmCTestVC).CTest;
    local_478._0_8_ = local_478 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"CVSUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_8d0,pcVar2,(string *)local_478);
    std::__cxx11::string::operator=((string *)&local_908,(string *)local_8d0);
    if ((pointer)local_8d0._0_8_ != pcVar1) {
      operator_delete((void *)local_8d0._0_8_,local_8d0._16_8_ + 1);
    }
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
    }
    command = (char *)local_908._M_string_length;
    if ((char *)local_908._M_string_length == (char *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_908,0,(char *)0x0,0x5910fd);
      command = extraout_RDX_01;
    }
  }
  cmSystemTools::ParseArguments_abi_cxx11_
            (&local_8e8,(cmSystemTools *)local_908._M_dataplus._M_p,command);
  if (((this->super_cmCTestVC).CTest)->TestModel == 1) {
    cmCTestVC::GetNightlyTime_abi_cxx11_(&local_928,&this->super_cmCTestVC);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_928,0,(char *)0x0,0x5b3cab);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_478._16_8_ = *psVar5;
      local_478._24_8_ = plVar4[3];
      local_478._0_8_ = local_478 + 0x10;
    }
    else {
      local_478._16_8_ = *psVar5;
      local_478._0_8_ = (size_type *)*plVar4;
    }
    local_478._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(local_478);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_8d0._16_8_ = *psVar5;
      local_8d0._24_8_ = plVar4[3];
      local_8d0._0_8_ = pcVar1;
    }
    else {
      local_8d0._16_8_ = *psVar5;
      local_8d0._0_8_ = (size_type *)*plVar4;
    }
    local_8d0._8_8_ = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_8e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d0);
    if ((pointer)local_8d0._0_8_ != pcVar1) {
      operator_delete((void *)local_8d0._0_8_,local_8d0._16_8_ + 1);
    }
    if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
      operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_928._M_dataplus._M_p != &local_928.field_2) {
      operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
    }
  }
  local_928._M_dataplus._M_p = (pointer)0x0;
  local_928._M_string_length = 0;
  local_928.field_2._M_allocated_capacity = 0;
  local_8d0._0_8_ = (this->super_cmCTestVC).CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_928,(iterator)0x0,
             (char **)local_8d0);
  local_8d0._0_8_ = "-z3";
  if (local_928._M_string_length == local_928.field_2._M_allocated_capacity) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_928,
               (iterator)local_928._M_string_length,(char **)local_8d0);
  }
  else {
    *(char **)local_928._M_string_length = "-z3";
    local_928._M_string_length = local_928._M_string_length + 8;
  }
  local_8d0._0_8_ = "update";
  if (local_928._M_string_length == local_928.field_2._M_allocated_capacity) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_928,
               (iterator)local_928._M_string_length,(char **)local_8d0);
  }
  else {
    *(char **)local_928._M_string_length = "update";
    local_928._M_string_length = local_928._M_string_length + 8;
  }
  if (local_8e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_8e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar6 = local_8e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_8d0._0_8_ = (pbVar6->_M_dataplus)._M_p;
      if (local_928._M_string_length == local_928.field_2._M_allocated_capacity) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_928,
                   (iterator)local_928._M_string_length,(char **)local_8d0);
      }
      else {
        *(undefined8 *)local_928._M_string_length = local_8d0._0_8_;
        local_928._M_string_length = local_928._M_string_length + 8;
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != local_8e8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_8d0._0_8_ = (pointer)0x0;
  if (local_928._M_string_length == local_928.field_2._M_allocated_capacity) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_928,
               (iterator)local_928._M_string_length,(char **)local_8d0);
  }
  else {
    *(char **)local_928._M_string_length = (char *)0x0;
    local_928._M_string_length = local_928._M_string_length + 8;
  }
  UpdateParser::UpdateParser((UpdateParser *)local_8d0,this,"up-out> ");
  UpdateParser::UpdateParser((UpdateParser *)local_478,this,"up-err> ");
  bVar3 = cmCTestVC::RunUpdateCommand
                    (&this->super_cmCTestVC,(char **)local_928._M_dataplus._M_p,
                     (OutputParser *)local_8d0,(OutputParser *)local_478);
  local_478._0_8_ = &PTR__UpdateParser_006ba820;
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  if (local_108 != (char *)0x0) {
    operator_delete__(local_108);
  }
  if (local_1d8 != (char *)0x0) {
    operator_delete__(local_1d8);
  }
  if (local_2a8 != (char *)0x0) {
    operator_delete__(local_2a8);
  }
  if (local_378 != (char *)0x0) {
    operator_delete__(local_378);
  }
  local_478._0_8_ = &PTR__LineParser_006bc790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._24_8_ != local_450) {
    operator_delete((void *)local_478._24_8_,local_450[0]._M_allocated_capacity + 1);
  }
  local_8d0._0_8_ = &PTR__UpdateParser_006ba820;
  if (local_490 != (char *)0x0) {
    operator_delete__(local_490);
  }
  if (local_560 != (char *)0x0) {
    operator_delete__(local_560);
  }
  if (local_630 != (char *)0x0) {
    operator_delete__(local_630);
  }
  if (local_700 != (char *)0x0) {
    operator_delete__(local_700);
  }
  if (local_7d0 != (char *)0x0) {
    operator_delete__(local_7d0);
  }
  local_8d0._0_8_ = &PTR__LineParser_006bc790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._24_8_ != local_8a8) {
    operator_delete((void *)local_8d0._24_8_,local_8a8[0]._M_allocated_capacity + 1);
  }
  if ((char **)local_928._M_dataplus._M_p != (char **)0x0) {
    operator_delete(local_928._M_dataplus._M_p,
                    local_928.field_2._M_allocated_capacity - (long)local_928._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestCVS::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if(opts.empty())
    {
    opts = this->CTest->GetCTestConfiguration("CVSUpdateOptions");
    if(opts.empty())
      {
      opts = "-dP";
      }
    }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts.c_str());

  // Specify the start time for nightly testing.
  if(this->CTest->GetTestModel() == cmCTest::NIGHTLY)
    {
    args.push_back("-D" + this->GetNightlyTime() + " UTC");
    }

  // Run "cvs update" to update the work tree.
  std::vector<char const*> cvs_update;
  cvs_update.push_back(this->CommandLineTool.c_str());
  cvs_update.push_back("-z3");
  cvs_update.push_back("update");
  for(std::vector<std::string>::const_iterator ai = args.begin();
      ai != args.end(); ++ai)
    {
    cvs_update.push_back(ai->c_str());
    }
  cvs_update.push_back(0);

  UpdateParser out(this, "up-out> ");
  UpdateParser err(this, "up-err> ");
  return this->RunUpdateCommand(&cvs_update[0], &out, &err);
}